

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::TriangleDraw::Cleanup(TriangleDraw *this)

{
  int width;
  int height;
  TriangleDraw *this_local;
  
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8ca8,0);
  glu::CallLogWrapper::glDisableVertexAttribArray
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  width = TGBase::GetWindowWidth((TGBase *)this);
  height = TGBase::GetWindowHeight((TGBase *)this);
  glu::CallLogWrapper::glViewport
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,width,height);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&(this->super_GatherBase).tex);
  glu::CallLogWrapper::glDeleteFramebuffers
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->fbo);
  glu::CallLogWrapper::glDeleteRenderbuffers
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->rbo);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->vao);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->vbo);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->program);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
		glDisableVertexAttribArray(0);
		glViewport(0, 0, GetWindowWidth(), GetWindowHeight());
		glDeleteTextures(1, &tex);
		glDeleteFramebuffers(1, &fbo);
		glDeleteRenderbuffers(1, &rbo);
		glDeleteVertexArrays(1, &vao);
		glDeleteBuffers(1, &vbo);
		glDeleteProgram(program);
		return NO_ERROR;
	}